

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::StringLiteral>
          (SequenceMethodExprVisitor *this,StringLiteral *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  Symbol *this_00;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  DiagCode unaff_retaddr;
  bool in_stack_00000017;
  Expression *in_stack_00000018;
  Symbol *sym;
  Diagnostic *this_01;
  SourceLocation SVar2;
  
  if (*(int *)in_RSI != 8) {
    return;
  }
  SVar2 = in_RDI;
  this_00 = Expression::getSymbolReference(in_stack_00000018,in_stack_00000017);
  if (this_00 == (Symbol *)0x0) {
    return;
  }
  if (this_00->kind != LocalAssertionVar) {
    if (this_00->kind != AssertionPort) {
      return;
    }
    Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x1367e6f);
    bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x1367e77);
    if (!bVar1) {
      return;
    }
  }
  this_01 = *(Diagnostic **)((long)in_RSI + 0x20);
  sourceRange.endLoc = SVar2;
  sourceRange.startLoc = in_RSI;
  ASTContext::addDiag((ASTContext *)this_00,unaff_retaddr,sourceRange);
  Diagnostic::operator<<(this_01,(string *)in_RDI);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (HasVisitExprs<T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }